

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cpp
# Opt level: O0

void peparse::IterExpVA(parsed_pe_conflict *pe,iterExp cb,void *cbd)

{
  bool bVar1;
  int iVar2;
  list<peparse::exportent,_std::allocator<peparse::exportent>_> *this;
  reference peVar3;
  undefined1 local_88 [8];
  exportent i;
  iterator __end1;
  iterator __begin1;
  list<peparse::exportent,_std::allocator<peparse::exportent>_> *__range1;
  list<peparse::exportent,_std::allocator<peparse::exportent>_> *l;
  void *cbd_local;
  iterExp cb_local;
  parsed_pe_conflict *pe_local;
  
  this = &pe->internal->exports;
  __end1 = std::__cxx11::list<peparse::exportent,_std::allocator<peparse::exportent>_>::begin(this);
  i.moduleName.field_2._8_8_ =
       std::__cxx11::list<peparse::exportent,_std::allocator<peparse::exportent>_>::end(this);
  while( true ) {
    bVar1 = std::operator!=(&__end1,(_Self *)((long)&i.moduleName.field_2 + 8));
    if (!bVar1) {
      return;
    }
    peVar3 = std::_List_iterator<peparse::exportent>::operator*(&__end1);
    exportent::exportent((exportent *)local_88,peVar3);
    iVar2 = (*cb)(cbd,(VA)local_88,(string *)((long)&i.symbolName.field_2 + 8),(string *)&i);
    exportent::~exportent((exportent *)local_88);
    if (iVar2 != 0) break;
    std::_List_iterator<peparse::exportent>::operator++(&__end1);
  }
  return;
}

Assistant:

void IterExpVA(parsed_pe *pe, iterExp cb, void *cbd) {
  list<exportent> &l = pe->internal->exports;

  for (exportent i : l) {
    if (cb(cbd, i.addr, i.moduleName, i.symbolName) != 0) {
      break;
    }
  }

  return;
}